

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                first,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      last,uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  FractionalInteger *pFVar1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  HighsInt HVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  pointer ppVar16;
  ulong uVar17;
  FractionalInteger *pFVar18;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar19;
  FractionalInteger *pFVar20;
  undefined3 in_register_00000089;
  size_t sVar21;
  undefined4 local_6c;
  undefined4 uStack_68;
  
  if (CONCAT31(in_register_00000089,use_swaps) == 0) {
    if (num != 0) {
      uVar17 = (ulong)*offsets_r;
      pFVar18 = last._M_current + -uVar17;
      pFVar20 = first._M_current + *offsets_l;
      dVar13 = pFVar20->fractionality;
      dVar14 = pFVar20->row_ep_norm2;
      uVar15 = *(undefined8 *)((long)&pFVar20->score + 4);
      uStack_68 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4) >> 0x20);
      local_6c = (undefined4)((ulong)dVar14 >> 0x20);
      ppVar4 = (pFVar20->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar16 = (pFVar20->row_ep).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (pFVar20->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pFVar20->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar20->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar20->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = *(undefined4 *)((long)&last._M_current[-uVar17].fractionality + 4);
      uVar7 = *(undefined4 *)&last._M_current[-uVar17].row_ep_norm2;
      uVar8 = *(undefined4 *)((long)&last._M_current[-uVar17].row_ep_norm2 + 4);
      uVar9 = *(undefined4 *)((long)&last._M_current[-uVar17].row_ep_norm2 + 4);
      uVar10 = *(undefined4 *)&last._M_current[-uVar17].score;
      uVar11 = *(undefined4 *)((long)&last._M_current[-uVar17].score + 4);
      HVar12 = last._M_current[-uVar17].basisIndex;
      *(undefined4 *)&pFVar20->fractionality =
           *(undefined4 *)&last._M_current[-uVar17].fractionality;
      *(undefined4 *)((long)&pFVar20->fractionality + 4) = uVar6;
      *(undefined4 *)&pFVar20->row_ep_norm2 = uVar7;
      *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4) = uVar8;
      *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4) = uVar9;
      *(undefined4 *)&pFVar20->score = uVar10;
      *(undefined4 *)((long)&pFVar20->score + 4) = uVar11;
      pFVar20->basisIndex = HVar12;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
                ();
      if (num != 1) {
        sVar21 = 1;
        do {
          pFVar20 = first._M_current + offsets_l[sVar21];
          uVar6 = *(undefined4 *)&pFVar20->fractionality;
          uVar7 = *(undefined4 *)((long)&pFVar20->fractionality + 4);
          uVar8 = *(undefined4 *)&pFVar20->row_ep_norm2;
          uVar9 = *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4);
          uVar10 = *(undefined4 *)&pFVar20->score;
          uVar11 = *(undefined4 *)((long)&pFVar20->score + 4);
          HVar12 = pFVar20->basisIndex;
          *(undefined4 *)((long)&pFVar18->row_ep_norm2 + 4) =
               *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4);
          *(undefined4 *)&pFVar18->score = uVar10;
          *(undefined4 *)((long)&pFVar18->score + 4) = uVar11;
          pFVar18->basisIndex = HVar12;
          *(undefined4 *)&pFVar18->fractionality = uVar6;
          *(undefined4 *)((long)&pFVar18->fractionality + 4) = uVar7;
          *(undefined4 *)&pFVar18->row_ep_norm2 = uVar8;
          *(undefined4 *)((long)&pFVar18->row_ep_norm2 + 4) = uVar9;
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(&pFVar18->row_ep,&pFVar20->row_ep);
          pFVar18 = last._M_current + -(ulong)offsets_r[sVar21];
          pFVar1 = last._M_current + -(ulong)offsets_r[sVar21];
          uVar6 = *(undefined4 *)&pFVar1->fractionality;
          uVar7 = *(undefined4 *)((long)&pFVar1->fractionality + 4);
          uVar8 = *(undefined4 *)&pFVar1->row_ep_norm2;
          uVar9 = *(undefined4 *)((long)&pFVar1->row_ep_norm2 + 4);
          uVar10 = *(undefined4 *)&pFVar1->score;
          uVar11 = *(undefined4 *)((long)&pFVar1->score + 4);
          HVar12 = pFVar1->basisIndex;
          *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4) =
               *(undefined4 *)((long)&pFVar1->row_ep_norm2 + 4);
          *(undefined4 *)&pFVar20->score = uVar10;
          *(undefined4 *)((long)&pFVar20->score + 4) = uVar11;
          pFVar20->basisIndex = HVar12;
          *(undefined4 *)&pFVar20->fractionality = uVar6;
          *(undefined4 *)((long)&pFVar20->fractionality + 4) = uVar7;
          *(undefined4 *)&pFVar20->row_ep_norm2 = uVar8;
          *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4) = uVar9;
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(&pFVar20->row_ep);
          sVar21 = sVar21 + 1;
        } while (num != sVar21);
      }
      *(ulong *)((long)&pFVar18->row_ep_norm2 + 4) = CONCAT44(uStack_68,local_6c);
      *(undefined8 *)((long)&pFVar18->score + 4) = uVar15;
      pFVar18->fractionality = dVar13;
      pFVar18->row_ep_norm2 = dVar14;
      ppVar5 = (pFVar18->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (pFVar18->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = ppVar4;
      (pFVar18->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar16;
      (pFVar18->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppVar3;
      if (ppVar5 != (pointer)0x0) {
        operator_delete(ppVar5);
      }
    }
  }
  else if (num != 0) {
    sVar21 = 0;
    do {
      pFVar18 = first._M_current + offsets_l[sVar21];
      pvVar19 = &pFVar18->row_ep;
      dVar13 = pFVar18->fractionality;
      dVar14 = pFVar18->row_ep_norm2;
      uVar15 = *(undefined8 *)((long)&pFVar18->score + 4);
      uStack_68 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar18->row_ep_norm2 + 4) >> 0x20);
      local_6c = (undefined4)((ulong)dVar14 >> 0x20);
      ppVar3 = (pFVar18->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar2 = &last._M_current[-(ulong)offsets_r[sVar21]].row_ep;
      ppVar16 = (pvVar19->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (pFVar18->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      (pvVar19->super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar18->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar18->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = *(undefined4 *)((long)(pvVar2 + -2) + 0x14);
      uVar7 = *(undefined4 *)(pvVar2 + -1);
      uVar8 = *(undefined4 *)((long)(pvVar2 + -1) + 4);
      uVar9 = *(undefined4 *)((long)(pvVar2 + -1) + 4);
      uVar10 = *(undefined4 *)((long)(pvVar2 + -1) + 8);
      uVar11 = *(undefined4 *)((long)(pvVar2 + -1) + 0xc);
      HVar12 = *(HighsInt *)((long)(pvVar2 + -1) + 0x10);
      *(undefined4 *)&pFVar18->fractionality = *(undefined4 *)((long)(pvVar2 + -2) + 0x10);
      *(undefined4 *)((long)&pFVar18->fractionality + 4) = uVar6;
      *(undefined4 *)&pFVar18->row_ep_norm2 = uVar7;
      *(undefined4 *)((long)&pFVar18->row_ep_norm2 + 4) = uVar8;
      *(undefined4 *)((long)&pFVar18->row_ep_norm2 + 4) = uVar9;
      *(undefined4 *)&pFVar18->score = uVar10;
      *(undefined4 *)((long)&pFVar18->score + 4) = uVar11;
      pFVar18->basisIndex = HVar12;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
                (pvVar19,pvVar2);
      *(ulong *)((long)(pvVar2 + -1) + 4) = CONCAT44(uStack_68,local_6c);
      *(undefined8 *)((long)(pvVar2 + -1) + 0xc) = uVar15;
      *(double *)((long)(pvVar2 + -2) + 0x10) = dVar13;
      *(double *)(pvVar2 + -1) = dVar14;
      ppVar4 = (pvVar2->
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      (pvVar2->super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
      ._M_impl.super__Vector_impl_data._M_start = ppVar16;
      (pvVar2->super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
      ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
      (pvVar2->super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar3;
      if (ppVar4 != (pointer)0x0) {
        operator_delete(ppVar4);
      }
      sVar21 = sVar21 + 1;
    } while (num != sVar21);
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }